

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhPageSplit(lhpage *pOld,lhpage *pNew,pgno split_bucket,pgno high_mask)

{
  int local_64;
  int rc;
  pgno iBucket;
  SyBlob sWorker;
  lhcell *pNext;
  lhcell *pCell;
  pgno high_mask_local;
  pgno split_bucket_local;
  lhpage *pNew_local;
  lhpage *pOld_local;
  
  SyBlobInit((SyBlob *)&iBucket,&pOld->pHash->sAllocator);
  pNext = pOld->pList;
  while (pNext != (lhcell *)0x0) {
    sWorker._24_8_ = pNext->pNext;
    if ((pNext->nHash & high_mask) != split_bucket) {
      if (pNext->iOvfl == 0) {
        SyBlobReset((SyBlob *)&iBucket);
        if ((((pNext->sKey).nByte == 0) &&
            (local_64 = lhConsumeCellkey(pNext,unqliteDataConsumer,&pNext->sKey,0), local_64 != 0))
           || (local_64 = lhConsumeCellData(pNext,unqliteDataConsumer,&iBucket), local_64 != 0))
        goto LAB_0011b194;
        local_64 = lhStoreCell(pNew,(pNext->sKey).pBlob,(pNext->sKey).nByte,sWorker.pAllocator,
                               (ulong)(uint)sWorker.pBlob,pNext->nHash,1);
      }
      else {
        local_64 = lhTransferCell(pNext,pNew);
      }
      if (local_64 != 0) goto LAB_0011b194;
      lhUnlinkCell(pNext);
    }
    pNext = (lhcell *)sWorker._24_8_;
  }
  local_64 = 0;
LAB_0011b194:
  SyBlobRelease((SyBlob *)&iBucket);
  return local_64;
}

Assistant:

static int lhPageSplit(
	lhpage *pOld,      /* Page to be split */
	lhpage *pNew,      /* New page */
	pgno split_bucket, /* Current split bucket */
	pgno high_mask     /* High mask (Max split bucket - 1) */
	)
{
	lhcell *pCell,*pNext;
	SyBlob sWorker;
	pgno iBucket;
	int rc; 
	SyBlobInit(&sWorker,&pOld->pHash->sAllocator);
	/* Perform the split */
	pCell = pOld->pList;
	for( ;; ){
		if( pCell == 0 ){
			/* No more cells */
			break;
		}
		/* Obtain the new logical bucket */
		iBucket = pCell->nHash & high_mask;
		pNext =  pCell->pNext;
		if( iBucket != split_bucket){
			rc = UNQLITE_OK;
			if( pCell->iOvfl ){
				/* Transfer the cell only */
				rc = lhTransferCell(pCell,pNew);
			}else{
				/* Transfer the cell and its payload */
				SyBlobReset(&sWorker);
				if( SyBlobLength(&pCell->sKey) < 1 ){
					/* Consume the key */
					rc = lhConsumeCellkey(pCell,unqliteDataConsumer,&pCell->sKey,0);
					if( rc != UNQLITE_OK ){
						goto fail;
					}
				}
				/* Consume the data (Very small data < 65k) */
				rc = lhConsumeCellData(pCell,unqliteDataConsumer,&sWorker);
				if( rc != UNQLITE_OK ){
					goto fail;
				}
				/* Perform the transfer */
				rc = lhStoreCell(
					pNew,
					SyBlobData(&pCell->sKey),(int)SyBlobLength(&pCell->sKey),
					SyBlobData(&sWorker),SyBlobLength(&sWorker),
					pCell->nHash,
					1
					);
			}
			if( rc != UNQLITE_OK ){
				goto fail;
			}
			/* Discard the cell from the old page */
			lhUnlinkCell(pCell);
		}
		/* Point to the next cell */
		pCell = pNext;
	}
	/* All done */
	rc = UNQLITE_OK;
fail:
	SyBlobRelease(&sWorker);
	return rc;
}